

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O0

int testUnsupportedEncoding(void)

{
  int iVar1;
  long lVar2;
  uint local_1c;
  int err;
  xmlError *error;
  xmlDocPtr doc;
  
  xmlResetLastError();
  lVar2 = xmlReadDoc("<doc/>",0,"#unsupported",0x40);
  if (lVar2 == 0) {
    fprintf(_stderr,"xmlReadDoc failed with unsupported encoding\n");
  }
  local_1c = (uint)(lVar2 == 0);
  xmlFreeDoc(lVar2);
  lVar2 = xmlGetLastError();
  if ((((lVar2 != 0) && (*(int *)(lVar2 + 4) == 0x20)) && (*(int *)(lVar2 + 0x10) == 1)) &&
     (iVar1 = strcmp(*(char **)(lVar2 + 8),"Unsupported encoding: #unsupported\n"), iVar1 == 0)) {
    return local_1c;
  }
  fprintf(_stderr,"xmlReadDoc failed to raise correct error\n");
  return 1;
}

Assistant:

static int
testUnsupportedEncoding(void) {
    xmlDocPtr doc;
    const xmlError *error;
    int err = 0;

    xmlResetLastError();

    doc = xmlReadDoc(BAD_CAST "<doc/>", NULL, "#unsupported",
                     XML_PARSE_NOWARNING);
    if (doc == NULL) {
        fprintf(stderr, "xmlReadDoc failed with unsupported encoding\n");
        err = 1;
    }
    xmlFreeDoc(doc);

    error = xmlGetLastError();
    if (error == NULL ||
        error->code != XML_ERR_UNSUPPORTED_ENCODING ||
        error->level != XML_ERR_WARNING ||
        strcmp(error->message, "Unsupported encoding: #unsupported\n") != 0)
    {
        fprintf(stderr, "xmlReadDoc failed to raise correct error\n");
        err = 1;
    }

    return err;
}